

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

TPZVec<double_*> * __thiscall
TPZVec<double_*>::operator=(TPZVec<double_*> *this,TPZVec<double_*> *rval)

{
  double **ppdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (this != rval) {
    this->fNElements = rval->fNElements;
    if (this->fStore != (double **)0x0) {
      operator_delete__(this->fStore);
    }
    if (rval->fNAlloc == 0) {
      uVar4 = this->fNElements;
      uVar3 = 0;
      ppdVar1 = (double **)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 * 8);
      this->fStore = ppdVar1;
      uVar2 = 0;
      if (0 < (long)uVar4) {
        uVar2 = uVar4;
      }
      for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        this->fStore[uVar3] = rval->fStore[uVar3];
      }
    }
    else {
      this->fStore = rval->fStore;
      uVar4 = this->fNElements;
    }
    this->fNAlloc = uVar4;
    rval->fStore = (double **)0x0;
    rval->fNElements = 0;
    rval->fNAlloc = 0;
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(TPZVec<T> &&rval){
	if(this != &rval){
        fNElements = rval.fNElements;
        if(fStore) delete [] fStore;
        if(rval.fNAlloc){
            fStore = rval.fStore;
        }else{
            fStore = new T[fNElements];
            for (int64_t i = 0; i < fNElements; i++)
                fStore[i] = rval.fStore[i];
        }
        fNAlloc = fNElements;//perhaps rval.fNalloc was 0
        rval.fStore = nullptr;
        rval.fNElements = 0;
        rval.fNAlloc = 0;
	}
	return *this;
}